

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.h
# Opt level: O1

void __thiscall trieste::detail::Make::error(Make *this,string *msg,size_t index)

{
  pointer psVar1;
  NodeDef *this_00;
  Location *pLVar2;
  undefined1 auStack_58 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  _Alloc_hider local_38;
  size_t sStack_30;
  Token local_28;
  
  if ((((this->node).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_
      ).def != (TokenDef *)Group) {
    local_28.def = (TokenDef *)Group;
    add(this,&local_28,0);
    psVar1 = (((this->node).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->children).
             super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (this->node).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         psVar1[-1].super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->node).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &psVar1[-1].super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  this_00 = (this->node).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pLVar2 = REMatch::at(&this->re_match,index);
  auStack_58._16_8_ =
       (pLVar2->source).super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_40._M_pi =
       (pLVar2->source).super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
    }
  }
  local_38._M_p = (pointer)pLVar2->pos;
  sStack_30 = pLVar2->len;
  make_error((Make *)auStack_58,(Location *)this,(string *)(auStack_58 + 0x10));
  NodeDef::push_back(this_00,(Node *)auStack_58);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_58._8_8_);
  }
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
  }
  return;
}

Assistant:

void error(const std::string& msg, size_t index = 0)
      {
        if (!in(Group))
          push(Group);

        node->push_back(make_error(re_match.at(index), msg));
      }